

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O3

unique_ptr<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
 __thiscall ApplicationFactory::makeRenderer(ApplicationFactory *this,Context *context)

{
  long *plVar1;
  SDLGraphicsSystem *this_00;
  Renderer *this_01;
  Context *in_RDX;
  string *this_02;
  _Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false> local_50;
  string local_48;
  
  plVar1 = (long *)operator_new(8);
  *plVar1 = (long)&PTR__Wrapper_00115c00;
  this_00 = (SDLGraphicsSystem *)operator_new(0x80);
  this_02 = &local_48;
  local_48._M_dataplus._M_p = (pointer)plVar1;
  solitaire::graphics::SDLGraphicsSystem::SDLGraphicsSystem
            (this_00,(unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
                      *)this_02);
  if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
  }
  findAssetsPath_abi_cxx11_(&local_48,(ApplicationFactory *)this_02);
  this_01 = (Renderer *)operator_new(0x50);
  local_50._M_head_impl = (GraphicsSystem *)this_00;
  solitaire::graphics::Renderer::Renderer
            (this_01,in_RDX,
             (unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
              *)&local_50,&local_48);
  if ((SDLGraphicsSystem *)local_50._M_head_impl != (SDLGraphicsSystem *)0x0) {
    (*((GraphicsSystem *)&(local_50._M_head_impl)->_vptr_GraphicsSystem)->_vptr_GraphicsSystem[1])()
    ;
  }
  *(Renderer **)this = this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>,_true,_true>
          )(__uniq_ptr_data<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<graphics::interfaces::Renderer>
ApplicationFactory::makeRenderer(
    const solitaire::interfaces::Context& context) const
{
    return std::make_unique<Renderer>(
        context,
        std::make_unique<SDLGraphicsSystem>(
            std::make_unique<SDL::Wrapper>()
        ),
        findAssetsPath()
    );
}